

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fDefaultVertexAttributeTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles2::Functional::anon_unknown_1::AttributeCase::verifyUnicoloredBuffer
          (AttributeCase *this,Surface *scene,Vec4 *refValue)

{
  RGBA y_00;
  byte bVar1;
  int iVar2;
  int iVar3;
  RenderTarget *this_00;
  PixelFormat *this_01;
  TestLog *pTVar4;
  MessageBuilder *pMVar5;
  int *piVar6;
  allocator<char> local_789;
  string local_788;
  allocator<char> local_761;
  string local_760;
  LogImage local_740;
  allocator<char> local_6a9;
  string local_6a8;
  allocator<char> local_681;
  string local_680;
  LogImage local_660;
  allocator<char> local_5c9;
  string local_5c8;
  allocator<char> local_5a1;
  string local_5a0;
  LogImageSet local_580;
  MessageBuilder local_540;
  MessageBuilder local_3c0;
  deUint32 local_240;
  Vector<int,_2> local_23c;
  RGBA local_234;
  int local_230;
  RGBA color;
  int x;
  int y;
  deUint32 local_a4;
  IVec4 local_a0;
  PixelBufferAccess local_90;
  Vector<int,_2> local_68;
  IVec2 examplePos;
  RGBA exampleColor;
  RGBA RStack_54;
  bool error;
  undefined4 local_50;
  RGBA colorThreshold;
  int resultThreshold;
  RGBA local_3c;
  undefined1 local_38 [4];
  RGBA refColor;
  Surface errorMask;
  Vec4 *refValue_local;
  Surface *scene_local;
  AttributeCase *this_local;
  
  tcu::Surface::Surface((Surface *)local_38,0x20,0x20);
  tcu::RGBA::RGBA(&local_3c,refValue);
  local_50 = 2;
  this_00 = Context::getRenderTarget((this->super_TestCase).m_context);
  this_01 = tcu::RenderTarget::getPixelFormat(this_00);
  exampleColor = tcu::PixelFormat::getColorThreshold(this_01);
  RStack_54 = tcu::operator*(&exampleColor,2);
  examplePos.m_data[1]._3_1_ = 0;
  tcu::RGBA::RGBA((RGBA *)&examplePos);
  tcu::Vector<int,_2>::Vector(&local_68);
  tcu::Surface::getAccess(&local_90,(Surface *)local_38);
  local_a4 = (deUint32)tcu::RGBA::green();
  tcu::RGBA::toIVec((RGBA *)&local_a0);
  tcu::clear(&local_90,&local_a0);
  pTVar4 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<((MessageBuilder *)&x,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar5 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)&x,
                      (char (*) [43])"Verifying rendered image. Expecting color ");
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_3c);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [13])", threshold ");
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&stack0xffffffffffffffac);
  tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&x);
  color.m_value = 0;
  do {
    if (0x1f < (int)color.m_value) {
      if ((examplePos.m_data[1]._3_1_ & 1) == 0) {
        pTVar4 = tcu::TestContext::getLog
                           ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_3c0,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar5 = tcu::MessageBuilder::operator<<
                           (&local_3c0,(char (*) [25])"Rendered image is valid.");
        tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_3c0);
      }
      else {
        pTVar4 = tcu::TestContext::getLog
                           ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_540,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar5 = tcu::MessageBuilder::operator<<
                           (&local_540,(char (*) [25])"Found invalid pixel(s).\n");
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [11])"Pixel at (");
        piVar6 = tcu::Vector<int,_2>::x(&local_68);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,piVar6);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0xafd70f);
        piVar6 = tcu::Vector<int,_2>::y(&local_68);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,piVar6);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [10])") color: ");
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(RGBA *)&examplePos);
        pTVar4 = tcu::MessageBuilder::operator<<
                           (pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_5a0,"Result",&local_5a1)
        ;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_5c8,"Render result",&local_5c9);
        tcu::LogImageSet::LogImageSet(&local_580,&local_5a0,&local_5c8);
        pTVar4 = tcu::TestLog::operator<<(pTVar4,&local_580);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_680,"Result",&local_681)
        ;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_6a8,"Result",&local_6a9)
        ;
        tcu::LogImage::LogImage
                  (&local_660,&local_680,&local_6a8,scene,QP_IMAGE_COMPRESSION_MODE_BEST);
        pTVar4 = tcu::TestLog::operator<<(pTVar4,&local_660);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_760,"ErrorMask",&local_761);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_788,"Error Mask",&local_789);
        tcu::LogImage::LogImage
                  (&local_740,&local_760,&local_788,(Surface *)local_38,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        pTVar4 = tcu::TestLog::operator<<(pTVar4,&local_740);
        tcu::TestLog::operator<<(pTVar4,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
        tcu::LogImage::~LogImage(&local_740);
        std::__cxx11::string::~string((string *)&local_788);
        std::allocator<char>::~allocator(&local_789);
        std::__cxx11::string::~string((string *)&local_760);
        std::allocator<char>::~allocator(&local_761);
        tcu::LogImage::~LogImage(&local_660);
        std::__cxx11::string::~string((string *)&local_6a8);
        std::allocator<char>::~allocator(&local_6a9);
        std::__cxx11::string::~string((string *)&local_680);
        std::allocator<char>::~allocator(&local_681);
        tcu::LogImageSet::~LogImageSet(&local_580);
        std::__cxx11::string::~string((string *)&local_5c8);
        std::allocator<char>::~allocator(&local_5c9);
        std::__cxx11::string::~string((string *)&local_5a0);
        std::allocator<char>::~allocator(&local_5a1);
        tcu::MessageBuilder::~MessageBuilder(&local_540);
      }
      bVar1 = examplePos.m_data[1]._3_1_ ^ 0xff;
      tcu::Surface::~Surface((Surface *)local_38);
      return (bool)(bVar1 & 1);
    }
    for (local_230 = 0; local_230 < 0x20; local_230 = local_230 + 1) {
      local_234 = tcu::Surface::getPixel(scene,local_230,color.m_value);
      iVar2 = tcu::RGBA::getRed(&local_234);
      iVar3 = tcu::RGBA::getRed(&local_3c);
      iVar2 = de::abs<int>(iVar2 - iVar3);
      iVar3 = tcu::RGBA::getRed(&stack0xffffffffffffffac);
      if (iVar3 < iVar2) {
LAB_00690796:
        if ((examplePos.m_data[1]._3_1_ & 1) == 0) {
          examplePos.m_data[0] = local_234.m_value;
          tcu::Vector<int,_2>::Vector(&local_23c,local_230,color.m_value);
          local_68.m_data[0] = local_23c.m_data[0];
          local_68.m_data[1] = local_23c.m_data[1];
        }
        y_00.m_value = color.m_value;
        iVar2 = local_230;
        examplePos.m_data[1]._3_1_ = 1;
        local_240 = (deUint32)tcu::RGBA::red();
        tcu::Surface::setPixel((Surface *)local_38,iVar2,y_00.m_value,(RGBA)local_240);
      }
      else {
        iVar2 = tcu::RGBA::getGreen(&local_234);
        iVar3 = tcu::RGBA::getGreen(&local_3c);
        iVar2 = de::abs<int>(iVar2 - iVar3);
        iVar3 = tcu::RGBA::getGreen(&stack0xffffffffffffffac);
        if (iVar3 < iVar2) goto LAB_00690796;
        iVar2 = tcu::RGBA::getBlue(&local_234);
        iVar3 = tcu::RGBA::getBlue(&local_3c);
        iVar2 = de::abs<int>(iVar2 - iVar3);
        iVar3 = tcu::RGBA::getBlue(&stack0xffffffffffffffac);
        if (iVar3 < iVar2) goto LAB_00690796;
      }
    }
    color.m_value = color.m_value + 1;
  } while( true );
}

Assistant:

bool AttributeCase::verifyUnicoloredBuffer (const tcu::Surface& scene, const tcu::Vec4& refValue)
{
	tcu::Surface	errorMask		(RENDER_SIZE, RENDER_SIZE);
	const tcu::RGBA	refColor		(refValue);
	const int		resultThreshold	= 2;
	const tcu::RGBA	colorThreshold	= m_context.getRenderTarget().getPixelFormat().getColorThreshold() * resultThreshold;
	bool			error			= false;

	tcu::RGBA		exampleColor;
	tcu::IVec2		examplePos;

	tcu::clear(errorMask.getAccess(), tcu::RGBA::green().toIVec());

	m_testCtx.getLog() << tcu::TestLog::Message << "Verifying rendered image. Expecting color " << refColor << ", threshold " << colorThreshold << tcu::TestLog::EndMessage;

	for (int y = 0; y < RENDER_SIZE; ++y)
	for (int x = 0; x < RENDER_SIZE; ++x)
	{
		const tcu::RGBA color = scene.getPixel(x, y);

		if (de::abs(color.getRed()   - refColor.getRed())   > colorThreshold.getRed()   ||
			de::abs(color.getGreen() - refColor.getGreen()) > colorThreshold.getGreen() ||
			de::abs(color.getBlue()  - refColor.getBlue())  > colorThreshold.getBlue())
		{
			// first error
			if (!error)
			{
				exampleColor = color;
				examplePos = tcu::IVec2(x, y);
			}

			error = true;
			errorMask.setPixel(x, y, tcu::RGBA::red());
		}
	}

	if (!error)
		m_testCtx.getLog() << tcu::TestLog::Message << "Rendered image is valid." << tcu::TestLog::EndMessage;
	else
	{
		m_testCtx.getLog()	<< tcu::TestLog::Message
							<< "Found invalid pixel(s).\n"
							<< "Pixel at (" << examplePos.x() << ", " << examplePos.y() << ") color: " << exampleColor
							<< tcu::TestLog::EndMessage
							<< tcu::TestLog::ImageSet("Result", "Render result")
							<< tcu::TestLog::Image("Result", "Result", scene)
							<< tcu::TestLog::Image("ErrorMask", "Error Mask", errorMask)
							<< tcu::TestLog::EndImageSet;
	}

	return !error;
}